

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastio.h
# Opt level: O3

void __thiscall OutputStream::writeSQFloat(OutputStream *this,SQFloat f)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 uStack_1c;
  
  uVar2 = CONCAT44(uStack_1c,f);
  uVar3 = uVar2;
  if (0x7f < uVar2) {
    do {
      (**this->_vptr_OutputStream)(this,(ulong)(byte)((byte)uVar2 | 0x80));
      uVar3 = uVar2 >> 7;
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar3;
    } while (bVar1);
  }
  (**this->_vptr_OutputStream)(this,uVar3 & 0xff);
  return;
}

Assistant:

void writeSQFloat(SQFloat f) {
#ifdef SQUSEDOUBLE
    writeInt32(*((int32_t*)&f));
#else
    writeInt64(*((int64_t*)&f));
#endif // SQUSEDOUBLE
  }